

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Get_field(int g_a,int *lo,int *hi,int foff,int fsize,void *buf,int *ld)

{
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_stack_00000008;
  int i_2;
  int i_1;
  int i;
  Integer _ld [7];
  Integer _ahi [7];
  Integer _alo [7];
  Integer andim;
  Integer a;
  undefined4 in_stack_fffffffffffffef8;
  int iVar1;
  int iVar2;
  int iVar3;
  Integer in_stack_ffffffffffffff08;
  Integer *in_stack_ffffffffffffff10;
  Integer *in_stack_ffffffffffffff18;
  Integer in_stack_ffffffffffffff20;
  Integer *in_stack_ffffffffffffff30;
  long local_b8 [8];
  long local_78 [8];
  long local_38;
  long local_30;
  long local_18;
  long local_10;
  
  local_30 = (long)in_EDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_38 = pnga_ndim(andim);
  for (iVar3 = 0; iVar3 < local_38; iVar3 = iVar3 + 1) {
    local_78[(local_38 - iVar3) + -1] = (long)*(int *)(local_10 + (long)iVar3 * 4) + 1;
  }
  for (iVar2 = 0; iVar2 < local_38; iVar2 = iVar2 + 1) {
    local_b8[(local_38 - iVar2) + -1] = (long)*(int *)(local_18 + (long)iVar2 * 4) + 1;
  }
  for (iVar1 = 0; (long)iVar1 < local_38 + -1; iVar1 = iVar1 + 1) {
    *(long *)(&stack0xffffffffffffff08 + ((local_38 - iVar1) + -2) * 8) =
         (long)*(int *)(in_stack_00000008 + (long)iVar1 * 4) + 1;
  }
  pnga_get_field(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff08,CONCAT44(iVar3,iVar2),
                 (void *)CONCAT44(iVar1,in_stack_fffffffffffffef8),in_stack_ffffffffffffff30);
  return;
}

Assistant:

void NGA_Get_field(int g_a, int *lo, int *hi, int foff, int fsize,
		   void *buf, int *ld) {
  Integer a = (Integer)g_a;
  Integer andim = wnga_ndim(a);
  Integer _alo[MAXDIM], _ahi[MAXDIM];
  Integer _ld[MAXDIM];
  COPYINDEX_C2F(lo,_alo, andim);
  COPYINDEX_C2F(hi,_ahi, andim);
  COPYINDEX_C2F(ld, _ld, andim-1);

  wnga_get_field(a, _alo, _ahi, foff, fsize, buf, _ld);
}